

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O0

SUNErrCode SUNMatScaleAdd_Band(sunrealtype c,SUNMatrix A,SUNMatrix B)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long *in_RSI;
  long *in_RDI;
  double in_XMM0_Qa;
  sunrealtype *B_colj;
  sunrealtype *A_colj;
  sunindextype j;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  undefined8 local_38;
  undefined8 local_30;
  
  if ((*(long *)(*in_RDI + 0x18) < *(long *)(*in_RSI + 0x18)) ||
     (*(long *)(*in_RDI + 0x20) < *(long *)(*in_RSI + 0x20))) {
    SMScaleAddNew_Band((sunrealtype)A,B,(SUNMatrix)sunctx_local_scope_);
  }
  else {
    for (local_38 = 0; local_38 < *(long *)(*in_RDI + 8); local_38 = local_38 + 1) {
      lVar3 = *(long *)(*(long *)(*in_RDI + 0x40) + local_38 * 8) + *(long *)(*in_RDI + 0x28) * 8;
      lVar1 = *(long *)(*(long *)(*in_RSI + 0x40) + local_38 * 8);
      lVar2 = *(long *)(*in_RSI + 0x28);
      for (local_30 = -*(long *)(*in_RSI + 0x18); local_30 <= *(long *)(*in_RSI + 0x20);
          local_30 = local_30 + 1) {
        *(double *)(lVar3 + local_30 * 8) =
             in_XMM0_Qa * *(double *)(lVar3 + local_30 * 8) +
             *(double *)(lVar1 + lVar2 * 8 + local_30 * 8);
      }
    }
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatScaleAdd_Band(sunrealtype c, SUNMatrix A, SUNMatrix B)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j;
  sunrealtype *A_colj, *B_colj;

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);
  SUNAssert(SUNMatGetID(B) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);
  SUNCheck(compatibleMatrices(A, B), SUN_ERR_ARG_DIMSMISMATCH);

  /* Call separate routine in B has larger bandwidth(s) than A */
  if ((SM_UBAND_B(B) > SM_UBAND_B(A)) || (SM_LBAND_B(B) > SM_LBAND_B(A)))
  {
    SUNCheckCall(SMScaleAddNew_Band(c, A, B));
    return SUN_SUCCESS;
  }

  /* Otherwise, perform operation in-place */
  for (j = 0; j < SM_COLUMNS_B(A); j++)
  {
    A_colj = SM_COLUMN_B(A, j);
    B_colj = SM_COLUMN_B(B, j);
    for (i = -SM_UBAND_B(B); i <= SM_LBAND_B(B); i++)
    {
      A_colj[i] = c * A_colj[i] + B_colj[i];
    }
  }
  return SUN_SUCCESS;
}